

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O0

void __thiscall dh::token::token(token *this,token *other)

{
  token *other_local;
  token *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)other);
  this->_type = other->_type;
  this->_lineno = other->_lineno;
  return;
}

Assistant:

token::token( const token& other)
{
	this->_val = other._val;
	this->_type = other._type;
	this->_lineno = other._lineno;
}